

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O3

QueryResult * __thiscall
OnDiskIndex::query(QueryResult *__return_storage_ptr__,OnDiskIndex *this,TriGram trigram,
                  QueryCounters *counters)

{
  SortedRun local_40;
  
  query_primitive(&local_40,this,trigram,&counters->reads_);
  SortedRun::SortedRun(&__return_storage_ptr__->results,&local_40);
  __return_storage_ptr__->has_everything = false;
  if (local_40.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.run_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.run_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.sequence_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.sequence_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.sequence_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

QueryResult OnDiskIndex::query(TriGram trigram, QueryCounters *counters) const {
    return QueryResult(std::move(query_primitive(trigram, &counters->reads())));
}